

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::traverse_all_reachable_opcodes
          (Compiler *this,SPIRBlock *block,OpcodeHandler *handler)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  Instruction *pIVar4;
  uint32_t *puVar5;
  SPIRFunction *pSVar6;
  SPIRFunction *func;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  OpcodeHandler *handler_local;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  (*handler->_vptr_OpcodeHandler[5])(handler,block);
  (*handler->_vptr_OpcodeHandler[6])(handler,block);
  __end1 = VectorView<spirv_cross::Instruction>::begin
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  pIVar4 = VectorView<spirv_cross::Instruction>::end
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  do {
    if (__end1 == pIVar4) {
      uVar3 = (*handler->_vptr_OpcodeHandler[3])(handler,block);
      return (uVar3 & 1) != 0;
    }
    puVar5 = stream(this,__end1);
    uVar1 = __end1->op;
    uVar3 = (*handler->_vptr_OpcodeHandler[2])
                      (handler,(ulong)(uint)uVar1,puVar5,(ulong)__end1->length);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    if (uVar1 == 0x39) {
      pSVar6 = get<spirv_cross::SPIRFunction>(this,puVar5[2]);
      uVar3 = (*handler->_vptr_OpcodeHandler[4])(handler,pSVar6);
      if ((uVar3 & 1) != 0) {
        uVar3 = (*handler->_vptr_OpcodeHandler[7])(handler,puVar5,(ulong)__end1->length);
        if ((uVar3 & 1) == 0) {
          return false;
        }
        pSVar6 = get<spirv_cross::SPIRFunction>(this,puVar5[2]);
        bVar2 = traverse_all_reachable_opcodes(this,pSVar6,handler);
        if (!bVar2) {
          return false;
        }
        uVar3 = (*handler->_vptr_OpcodeHandler[8])(handler,puVar5,(ulong)__end1->length);
        if ((uVar3 & 1) == 0) {
          return false;
        }
        (*handler->_vptr_OpcodeHandler[6])(handler,block);
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool Compiler::traverse_all_reachable_opcodes(const SPIRBlock &block, OpcodeHandler &handler) const
{
	handler.set_current_block(block);
	handler.rearm_current_block(block);

	// Ideally, perhaps traverse the CFG instead of all blocks in order to eliminate dead blocks,
	// but this shouldn't be a problem in practice unless the SPIR-V is doing insane things like recursing
	// inside dead blocks ...
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		if (!handler.handle(op, ops, i.length))
			return false;

		if (op == OpFunctionCall)
		{
			auto &func = get<SPIRFunction>(ops[2]);
			if (handler.follow_function_call(func))
			{
				if (!handler.begin_function_scope(ops, i.length))
					return false;
				if (!traverse_all_reachable_opcodes(get<SPIRFunction>(ops[2]), handler))
					return false;
				if (!handler.end_function_scope(ops, i.length))
					return false;

				handler.rearm_current_block(block);
			}
		}
	}

	if (!handler.handle_terminator(block))
		return false;

	return true;
}